

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkGraphicsPipelineLibraryCreateInfoEXT *
Fossilize::find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>(VkStructureType sType,void *pNext)

{
  VkBaseInStructure *base_in;
  void *pNext_local;
  VkStructureType sType_local;
  
  base_in = (VkBaseInStructure *)pNext;
  while( true ) {
    if (base_in == (VkBaseInStructure *)0x0) {
      return (VkGraphicsPipelineLibraryCreateInfoEXT *)0x0;
    }
    if (base_in->sType == sType) break;
    base_in = base_in->pNext;
  }
  return (VkGraphicsPipelineLibraryCreateInfoEXT *)base_in;
}

Assistant:

static const T *find_pnext(VkStructureType sType, const void *pNext)
{
	while (pNext)
	{
		auto *base_in = static_cast<const VkBaseInStructure *>(pNext);
		if (base_in->sType == sType)
			return static_cast<const T *>(pNext);
		pNext = base_in->pNext;
	}
	return nullptr;
}